

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O2

uint __thiscall
RigidBodyDynamics::ConstraintSet::AddCustomConstraint
          (ConstraintSet *this,shared_ptr<RigidBodyDynamics::Constraint> *customConstraint)

{
  vector<RigidBodyDynamics::ConstraintType,_std::allocator<RigidBodyDynamics::ConstraintType>_>
  *this_00;
  long lVar1;
  long lVar2;
  ConstraintSet *pCVar3;
  ConstraintSet *pCVar4;
  ulong uVar5;
  element_type *peVar6;
  ostream *poVar7;
  RBDLError *pRVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint i;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
  pVar12;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> pVar13;
  allocator_type local_28d;
  uint local_28c;
  ConstraintSet *local_288;
  shared_ptr<RigidBodyDynamics::Constraint> *local_280;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_278;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_270;
  ulong local_268;
  string nameStr;
  string local_240;
  string local_220;
  string local_200;
  value_type local_1e0;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_1c8 [8];
  undefined8 local_1c0;
  stringstream errormsg;
  ostream local_1a8 [16];
  uint local_198;
  
  lVar1 = *(long *)(this + 0xd0);
  uVar11 = (ulong)(*(long *)(this + 0x10) - *(long *)(this + 8)) >> 2;
  iVar10 = (int)uVar11;
  local_28c = ((customConstraint->
               super___shared_ptr<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              )->sizeOfConstraint + iVar10;
  lVar2 = *(long *)(this + 200);
  std::
  vector<std::shared_ptr<RigidBodyDynamics::Constraint>,std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>>>
  ::emplace_back<std::shared_ptr<RigidBodyDynamics::Constraint>&>
            ((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>>>
              *)(this + 200),customConstraint);
  *(int *)(*(long *)(*(long *)(this + 200) + (lVar1 - lVar2 & 0xffffffff0U)) + 0x34) = iVar10;
  local_268 = uVar11;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nameStr,"",(allocator<char> *)&errormsg);
  local_280 = customConstraint;
  if ((((customConstraint->
        super___shared_ptr<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->name
      )._M_dataplus._M_p != (pointer)0x0) {
    std::__cxx11::string::assign((char *)&nameStr);
  }
  local_270 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x110);
  uVar11 = (ulong)local_28c;
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
  ::run(local_270,uVar11);
  local_278 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x120);
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
  ::run(local_278,uVar11);
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
  ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x130),uVar11);
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
  ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x140),uVar11);
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
  ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x150),uVar11);
  local_1c0 = 0;
  local_288 = this;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_1e0,local_1c8);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::vector
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)&errormsg,uVar11,&local_1e0,&local_28d
            );
  pCVar3 = local_288;
  this_00 = (vector<RigidBodyDynamics::ConstraintType,_std::allocator<RigidBodyDynamics::ConstraintType>_>
             *)(local_288 + 8);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::_M_move_assign
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(local_288 + 0x600),&errormsg);
  std::_Vector_base<Vector3_t,_std::allocator<Vector3_t>_>::~_Vector_base
            ((_Vector_base<Vector3_t,_std::allocator<Vector3_t>_> *)&errormsg);
  for (uVar11 = 0; pCVar4 = local_288,
      peVar6 = (local_280->
               super___shared_ptr<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      , uVar11 < peVar6->sizeOfConstraint; uVar11 = uVar11 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(pCVar3 + 0x20),&nameStr);
    _errormsg = 2;
    std::
    vector<RigidBodyDynamics::ConstraintType,_std::allocator<RigidBodyDynamics::ConstraintType>_>::
    emplace_back<RigidBodyDynamics::ConstraintType>(this_00,(ConstraintType *)&errormsg);
    uVar5 = (ulong)(uint)((int)local_268 + (int)uVar11);
    *(undefined8 *)(*(long *)local_270 + uVar5 * 8) = 0;
    *(undefined8 *)(*(long *)local_278 + uVar5 * 8) = 0;
    *(undefined8 *)(*(long *)(this + 0x130) + uVar5 * 8) = 0;
    *(undefined8 *)(*(long *)(this + 0x140) + uVar5 * 8) = 0;
    *(undefined8 *)(*(long *)(this + 0x150) + uVar5 * 8) = 0;
  }
  if (nameStr._M_string_length != 0) {
    lVar1 = *(long *)(local_288 + 200);
    lVar2 = *(long *)(local_288 + 0xd0);
    std::__cxx11::string::string
              ((string *)&errormsg,(string *)(*(long *)(local_288 + 0x28) + -0x20));
    local_198 = (int)((ulong)(lVar2 - lVar1) >> 4) - 1;
    pVar12 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
             ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                         *)(pCVar4 + 0x38),
                        (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                         *)&errormsg);
    std::__cxx11::string::~string((string *)&errormsg);
    if (pVar12.second == false) {
      pRVar8 = (RBDLError *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_200,"Error: optional name is not unique.\n",
                 (allocator<char> *)&errormsg);
      Errors::RBDLError::RBDLError(pRVar8,&local_200);
      __cxa_throw(pRVar8,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
    }
    peVar6 = (local_280->
             super___shared_ptr<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  _errormsg = peVar6->id;
  if (_errormsg != 0xffffffff) {
    pVar13 = std::
             _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
             ::_M_emplace_unique<std::pair<unsigned_int,unsigned_int>>
                       ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                         *)(local_288 + 0x68),(pair<unsigned_int,_unsigned_int> *)&errormsg);
    if (pVar13.second == false) {
      pRVar8 = (RBDLError *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_220,"Error: optional userDefinedId is not unique.\n",
                 (allocator<char> *)&errormsg);
      Errors::RBDLError::RBDLError(pRVar8,&local_220);
      __cxa_throw(pRVar8,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
    }
  }
  uVar9 = local_28c - 1;
  _errormsg = uVar9;
  pVar13 = std::
           _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
           ::_M_emplace_unique<std::pair<unsigned_int,unsigned_int>>
                     ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                       *)(local_288 + 0x98),(pair<unsigned_int,_unsigned_int> *)&errormsg);
  if (pVar13.second != false) {
    std::__cxx11::string::~string((string *)&nameStr);
    return uVar9;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&errormsg);
  poVar7 = std::operator<<(local_1a8,"Error: Constraint row entry into system is not unique.");
  poVar7 = std::operator<<(poVar7,
                           " (This should not be possible: contact the maintainer of this code.)");
  std::endl<char,std::char_traits<char>>(poVar7);
  pRVar8 = (RBDLError *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  Errors::RBDLError::RBDLError(pRVar8,&local_240);
  __cxa_throw(pRVar8,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
}

Assistant:

unsigned int ConstraintSet::AddCustomConstraint(
  std::shared_ptr<Constraint> customConstraint)
{
  unsigned int insertAtRowInG = unsigned(size());
  unsigned int rowsInG = insertAtRowInG+customConstraint->getConstraintSize();
  unsigned int cIndex = constraints.size();

  constraints.emplace_back(customConstraint);
  constraints[cIndex]->addToConstraintSet(insertAtRowInG);

  //Resize constraint set system variables
  std::string nameStr("");
  if(customConstraint->getName() != NULL) {
    nameStr = customConstraint->getName();
  }

  err.conservativeResize(     rowsInG);
  errd.conservativeResize(    rowsInG);
  force.conservativeResize (  rowsInG);
  impulse.conservativeResize (rowsInG);
  v_plus.conservativeResize ( rowsInG);
  d_multdof3_u = std::vector<Math::Vector3d>(rowsInG, Math::Vector3d::Zero());

  for(unsigned int i=0; i<customConstraint->getConstraintSize(); ++i) {
    //The list of names, constraint types, and ids must have the same
    //number of entries as G has rows.
    name.push_back (nameStr);
    constraintType.push_back (ConstraintTypeCustom);


    err[      insertAtRowInG+i ] = 0.;
    errd[     insertAtRowInG+i ] = 0.;
    force[    insertAtRowInG+i ] = 0.;
    impulse[  insertAtRowInG+i ] = 0.;
    v_plus[   insertAtRowInG+i ] = 0.;
  }

  //Set up access maps
  if(nameStr.size() > 0) {
    std::pair< std::map<std::string, unsigned int>::iterator, bool > iter;
    iter = nameGroupMap.insert(std::pair<std::string, unsigned int>(
                                 name[name.size()-1],
                                 unsigned(constraints.size()-1)));
    if(iter.second == false) {
      throw Errors::RBDLError("Error: optional name is not unique.\n");
    }

  }
  if(customConstraint->getUserDefinedId()
      < std::numeric_limits<unsigned int>::max()) {
    std::pair< std::map<unsigned int, unsigned int>::iterator, bool > iter;
    iter =userDefinedIdGroupMap.insert( std::pair<unsigned int, unsigned int>(
                                          customConstraint->getUserDefinedId(),
                                          unsigned(constraints.size()-1)));
    if(iter.second == false) {
      throw Errors::RBDLError("Error: optional userDefinedId is not unique.\n");
    }

  }

  std::pair< std::map<unsigned int, unsigned int>::iterator, bool > iter;
  iter = idGroupMap.insert(std::pair<unsigned int, unsigned int>(
                             unsigned(rowsInG-1),
                             unsigned(constraints.size()-1)));
  if(iter.second == false) {
    std::stringstream errormsg;
    errormsg << "Error: Constraint row entry into system is not unique."
             << " (This should not be possible: contact the "
             "maintainer of this code.)"
             << std::endl;
    throw Errors::RBDLError(errormsg.str());
  }

  return rowsInG-1;

}